

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<long,long,duckdb::ParquetCastOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long *plVar1;
  ColumnWriterStatistics *stats_00;
  const_data_ptr_t pdVar2;
  ulong in_RCX;
  ulong in_RDX;
  undefined8 *in_R9;
  long target_value;
  idx_t r;
  idx_t local_write_count;
  long local_write [2048];
  long *ptr;
  long in_stack_ffffffffffffbfa8;
  ulong local_4048;
  
  plVar1 = FlatVector::GetData<long>((Vector *)0x22bd6c4);
  for (local_4048 = in_RDX; local_4048 < in_RCX; local_4048 = local_4048 + 1) {
    stats_00 = (ColumnWriterStatistics *)
               ParquetCastOperator::Operation<long,long>(plVar1[local_4048]);
    ParquetCastOperator::HandleStats<long,long>(stats_00,in_stack_ffffffffffffbfa8);
  }
  pdVar2 = const_data_ptr_cast<long>(plVar1 + in_RDX);
  (**(code **)*in_R9)(in_R9,pdVar2,(in_RCX - in_RDX) * 8);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}